

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

double __thiscall Graph::evaluateLossesAndFlows(Graph *this,double tol,int idLoadFactorGlobal)

{
  double dVar1;
  double dVar2;
  Vertex *pVVar3;
  double *pdVar4;
  double *pdVar5;
  Edge *pEVar6;
  int it;
  
  for (pVVar3 = this->verticesList; pVVar3 != (Vertex *)0x0; pVVar3 = pVVar3->nextVertex) {
    for (pEVar6 = pVVar3->edgesList; pEVar6 != (Edge *)0x0; pEVar6 = pEVar6->nextEdge) {
      pEVar6->activePowerFlow = 0.0;
      pEVar6->reactivePowerFlow = 0.0;
      pEVar6->activeLoss = 0.0;
      pEVar6->reactiveLoss = 0.0;
    }
  }
  Vertex::idLF = idLoadFactorGlobal;
  pdVar4 = getLosses(this);
  if (tol < 1.0) {
    it = 0;
    do {
      pVVar3 = this->verticesList;
      pVVar3->voltage = 1.0;
      auxForward(this,pVVar3,pVVar3->edgesList,it);
      pVVar3 = this->verticesList;
      pVVar3->voltage = 1.0;
      auxBackward(this,pVVar3);
      pdVar5 = getLosses(this);
      dVar1 = *pdVar5;
      dVar2 = *pdVar4;
      operator_delete(pdVar4,8);
      it = it + 1;
      pdVar4 = pdVar5;
    } while (tol < dVar1 - dVar2);
  }
  pdVar4 = getLosses(this);
  return *pdVar4;
}

Assistant:

double Graph::evaluateLossesAndFlows(double tol, int idLoadFactorGlobal){
    this->resetFlowAndLoss();
    Vertex::idLF = idLoadFactorGlobal; /// Static Param. Muda rede toda

    double *last_total_loss, *current_total_loss , error = 1.0;

    last_total_loss = this->getLosses();
    for( int it = 0; error>tol; it++ ){
        forward(it);        // Calcula fluxos de potencia nas linhas
        backward();         // Calcula voltagem nas barras e perdas nas linhas

        current_total_loss = this->getLosses();
        error = current_total_loss[0] - last_total_loss[0];
        delete last_total_loss;

        last_total_loss = current_total_loss;
    }
    return this->getLosses()[0];
}